

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O2

reference __thiscall
ft::deque<int,_ft::allocator<int>_>::back(deque<int,_ft::allocator<int>_> *this)

{
  dequeIterator<int,_64UL> local_38;
  
  dequeIterator<int,_64UL>::dequeIterator(&local_38,&this->m_finish);
  if (local_38.m_cur == local_38.m_first) {
    local_38.m_cur = local_38.m_node[-1] + 0x40;
  }
  return local_38.m_cur + -1;
}

Assistant:

reference 		back() {
		iterator	tmp = this->m_finish;
		--tmp;
		return *tmp;
	}